

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_3_channels_with_n_coeffs_mod0
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pfVar7 = horizontal_coefficients + 4;
  pfVar6 = output_buffer;
  while( true ) {
    lVar9 = (long)(horizontal_contributors->n0 * 3);
    pfVar8 = decode_buffer + lVar9;
    fVar21 = *horizontal_coefficients;
    fVar12 = horizontal_coefficients[1];
    fVar15 = horizontal_coefficients[2];
    fVar18 = horizontal_coefficients[3];
    fVar19 = *pfVar8 * fVar21;
    fVar20 = pfVar8[1] * fVar21;
    fVar21 = pfVar8[2] * fVar21;
    fVar22 = pfVar8[3] * fVar12;
    fVar11 = fVar12 * pfVar8[4];
    fVar12 = fVar12 * pfVar8[5];
    fVar13 = fVar15 * pfVar8[6];
    fVar14 = fVar15 * pfVar8[7];
    fVar15 = fVar15 * pfVar8[8];
    fVar16 = fVar18 * pfVar8[9];
    fVar17 = fVar18 * pfVar8[10];
    fVar18 = fVar18 * pfVar8[0xb];
    pfVar8 = decode_buffer + lVar9 + 0xc;
    iVar5 = (horizontal_contributors->n1 - horizontal_contributors->n0 >> 2) + 1;
    pfVar10 = pfVar7;
    do {
      fVar1 = *pfVar10;
      fVar2 = pfVar10[1];
      fVar3 = pfVar10[2];
      fVar4 = pfVar10[3];
      fVar19 = fVar19 + *pfVar8 * fVar1;
      fVar20 = fVar20 + pfVar8[1] * fVar1;
      fVar21 = fVar21 + pfVar8[2] * fVar1;
      fVar22 = fVar22 + pfVar8[3] * fVar2;
      fVar11 = fVar11 + fVar2 * pfVar8[4];
      fVar12 = fVar12 + fVar2 * pfVar8[5];
      fVar13 = fVar13 + fVar3 * pfVar8[6];
      fVar14 = fVar14 + fVar3 * pfVar8[7];
      fVar15 = fVar15 + fVar3 * pfVar8[8];
      fVar16 = fVar16 + fVar4 * pfVar8[9];
      fVar17 = fVar17 + fVar4 * pfVar8[10];
      fVar18 = fVar18 + fVar4 * pfVar8[0xb];
      pfVar8 = pfVar8 + 0xc;
      iVar5 = iVar5 + -1;
      pfVar10 = pfVar10 + 4;
    } while (1 < iVar5);
    fVar13 = fVar13 + fVar19 + fVar16 + fVar22;
    fVar11 = fVar14 + fVar20 + fVar17 + fVar11;
    fVar12 = fVar15 + fVar21 + fVar18 + fVar12;
    if (output_buffer + output_sub_size * 3 <= pfVar6 + 3) break;
    horizontal_contributors = horizontal_contributors + 1;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    *pfVar6 = fVar13;
    pfVar6[1] = fVar11;
    pfVar6[2] = fVar12;
    pfVar6[3] = fVar16 + fVar22 + fVar15 + fVar21;
    pfVar7 = pfVar7 + coefficient_width;
    pfVar6 = pfVar6 + 3;
  }
  *(ulong *)pfVar6 = CONCAT44(fVar11,fVar13);
  pfVar6[2] = fVar12;
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod0 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 4 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__store_output();
  } while ( output < output_end );
}